

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter_inc.h
# Opt level: O0

void BuildBlockHistogramsDistance
               (uint16_t *data,size_t length,uint8_t *block_ids,size_t num_histograms,
               HistogramDistance *histograms)

{
  byte bVar1;
  HistogramDistance *__s;
  ulong local_68;
  size_t i;
  HistogramDistance *histograms_local;
  size_t num_histograms_local;
  uint8_t *block_ids_local;
  size_t length_local;
  uint16_t *data_local;
  size_t i_1;
  
  for (data_local = (uint16_t *)0x0; data_local < num_histograms;
      data_local = (uint16_t *)((long)data_local + 1)) {
    __s = histograms + (long)data_local;
    memset(__s,0,0x820);
    __s->total_count_ = 0;
    __s->bit_cost_ = INFINITY;
  }
  for (local_68 = 0; local_68 < length; local_68 = local_68 + 1) {
    bVar1 = block_ids[local_68];
    histograms[bVar1].data_[data[local_68]] = histograms[bVar1].data_[data[local_68]] + 1;
    histograms[bVar1].total_count_ = histograms[bVar1].total_count_ + 1;
  }
  return;
}

Assistant:

static void FN(BuildBlockHistograms)(const DataType* data, const size_t length,
                                     const uint8_t* block_ids,
                                     const size_t num_histograms,
                                     HistogramType* histograms) {
  size_t i;
  FN(ClearHistograms)(histograms, num_histograms);
  for (i = 0; i < length; ++i) {
    FN(HistogramAdd)(&histograms[block_ids[i]], data[i]);
  }
}